

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_FromTransaction_Test::TestBody(Psbt_FromTransaction_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  Psbt psbt2;
  AssertionResult gtest_ar;
  Psbt psbt;
  Transaction tx;
  undefined7 in_stack_fffffffffffffdb0;
  AssertHelper local_230;
  Message local_228;
  string local_220 [32];
  AssertionResult local_200;
  ByteData local_1f0;
  Psbt local_1d8;
  AssertHelper local_158;
  Message local_150 [4];
  string local_130 [32];
  AssertionResult local_110;
  Psbt local_100;
  allocator local_69;
  string local_68 [32];
  Transaction local_48 [72];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000"
             ,&local_69);
  cfd::core::Transaction::Transaction(local_48,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  cfd::Psbt::Psbt(&local_100,local_48);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_110,
             "\"70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000"
             ,pcVar3);
  std::__cxx11::string::~string(local_130);
  cfd::core::ByteData::~ByteData((ByteData *)0x25a450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!bVar1) {
    testing::Message::Message(local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x25a56e);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x3b8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message((Message *)0x25a5cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25a623);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_1d8,&local_1f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x25a655);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_200,
             "\"cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA="
             ,pcVar3);
  std::__cxx11::string::~string(local_220);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x25a763);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x3ba,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message((Message *)0x25a7af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25a7fb);
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(uVar2,in_stack_fffffffffffffdb0));
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(uVar2,in_stack_fffffffffffffdb0));
  cfd::core::Transaction::~Transaction((Transaction *)CONCAT17(uVar2,in_stack_fffffffffffffdb0));
  return;
}

Assistant:

TEST(Psbt, FromTransaction) {
  Transaction tx("0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000");
  Psbt psbt(tx);

  EXPECT_STREQ("70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA=", psbt2.GetBase64().c_str());
}